

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O3

int BZ2_bzRead(int *bzerror,BZFILE *b,void *buf,int len)

{
  FILE *__stream;
  Bool_conflict BVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  
  if (bzerror != (int *)0x0) {
    *bzerror = 0;
  }
  if ((b == (BZFILE *)0x0) || (*(undefined4 *)((long)b + 0x13e8) = 0, buf == (void *)0x0 || len < 0)
     ) {
    if (bzerror != (int *)0x0) {
      *bzerror = -2;
    }
    if (b != (BZFILE *)0x0) {
      *(undefined4 *)((long)b + 0x13e8) = 0xfffffffe;
    }
  }
  else if (*(char *)((long)b + 0x1394) == '\0') {
    if (len != 0) {
      *(int *)((long)b + 0x13b8) = len;
      *(void **)((long)b + 0x13b0) = buf;
      do {
        __stream = *b;
        iVar2 = ferror(__stream);
        if (iVar2 != 0) {
LAB_0047745c:
          if (bzerror != (int *)0x0) {
            *bzerror = -6;
          }
          *(undefined4 *)((long)b + 0x13e8) = 0xfffffffa;
          return 0;
        }
        if ((*(int *)((long)b + 0x13a0) == 0) && (BVar1 = myfeof((FILE *)__stream), BVar1 == '\0'))
        {
          sVar4 = fread((void *)((long)b + 8),1,5000,*b);
          iVar2 = ferror(*b);
          if (iVar2 != 0) goto LAB_0047745c;
          *(int *)((long)b + 0x1390) = (int)sVar4;
          *(int *)((long)b + 0x13a0) = (int)sVar4;
          *(void **)((long)b + 0x1398) = (void *)((long)b + 8);
        }
        uVar3 = BZ2_bzDecompress((bz_stream *)((long)b + 0x1398));
        if ((uVar3 & 0xfffffffb) != 0) {
          if (bzerror != (int *)0x0) {
            *bzerror = uVar3;
          }
          *(uint *)((long)b + 0x13e8) = uVar3;
          return 0;
        }
        if (uVar3 == 0) {
          BVar1 = myfeof(*b);
          if ((BVar1 != '\0') && (*(int *)((long)b + 0x13a0) == 0)) {
            if (*(int *)((long)b + 0x13b8) != 0) {
              if (bzerror != (int *)0x0) {
                *bzerror = -7;
              }
              *(undefined4 *)((long)b + 0x13e8) = 0xfffffff9;
              return 0;
            }
            goto LAB_00477426;
          }
        }
        else if (uVar3 == 4) {
          if (bzerror != (int *)0x0) {
            *bzerror = 4;
          }
          *(undefined4 *)((long)b + 0x13e8) = 4;
          return len - *(int *)((long)b + 0x13b8);
        }
        if (*(int *)((long)b + 0x13b8) == 0) {
LAB_00477426:
          if (bzerror != (int *)0x0) {
            *bzerror = 0;
          }
          *(undefined4 *)((long)b + 0x13e8) = 0;
          return len;
        }
      } while( true );
    }
    if (bzerror != (int *)0x0) {
      *bzerror = 0;
    }
    *(undefined4 *)((long)b + 0x13e8) = 0;
  }
  else {
    if (bzerror != (int *)0x0) {
      *bzerror = -1;
    }
    *(undefined4 *)((long)b + 0x13e8) = 0xffffffff;
  }
  return 0;
}

Assistant:

int BZ_API(BZ2_bzRead) 
           ( int*    bzerror, 
             BZFILE* b, 
             void*   buf, 
             int     len )
{
   Int32   n, ret;
   bzFile* bzf = (bzFile*)b;

   BZ_SETERR(BZ_OK);

   if (bzf == NULL || buf == NULL || len < 0)
      { BZ_SETERR(BZ_PARAM_ERROR); return 0; };

   if (bzf->writing)
      { BZ_SETERR(BZ_SEQUENCE_ERROR); return 0; };

   if (len == 0)
      { BZ_SETERR(BZ_OK); return 0; };

   bzf->strm.avail_out = len;
   bzf->strm.next_out = buf;

   while (True) {

      if (ferror(bzf->handle)) 
         { BZ_SETERR(BZ_IO_ERROR); return 0; };

      if (bzf->strm.avail_in == 0 && !myfeof(bzf->handle)) {
         n = fread ( bzf->buf, sizeof(UChar), 
                     BZ_MAX_UNUSED, bzf->handle );
         if (ferror(bzf->handle))
            { BZ_SETERR(BZ_IO_ERROR); return 0; };
         bzf->bufN = n;
         bzf->strm.avail_in = bzf->bufN;
         bzf->strm.next_in = bzf->buf;
      }

      ret = BZ2_bzDecompress ( &(bzf->strm) );

      if (ret != BZ_OK && ret != BZ_STREAM_END)
         { BZ_SETERR(ret); return 0; };

      if (ret == BZ_OK && myfeof(bzf->handle) && 
          bzf->strm.avail_in == 0 && bzf->strm.avail_out > 0)
         { BZ_SETERR(BZ_UNEXPECTED_EOF); return 0; };

      if (ret == BZ_STREAM_END)
         { BZ_SETERR(BZ_STREAM_END);
           return len - bzf->strm.avail_out; };
      if (bzf->strm.avail_out == 0)
         { BZ_SETERR(BZ_OK); return len; };
      
   }

   return 0; /*not reached*/
}